

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O3

bool RunCommand(char *comment,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *command,bool verbose,NumberFormat exitFormat,int *retCodeOut,
               _func_bool_int *retCodeOkay)

{
  uint uVar1;
  _func_int *p_Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  undefined7 in_register_00000011;
  string_view separator;
  string_view separator_00;
  int retCode;
  string output;
  int local_84;
  string local_80;
  NumberFormat local_5c;
  _func_bool_int *local_58;
  string local_50;
  
  local_5c = exitFormat;
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    local_58 = retCodeOkay;
    if (comment == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x894828);
    }
    else {
      sVar6 = strlen(comment);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,comment,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":\n",2);
    separator._M_str = " ";
    separator._M_len = 1;
    cmJoin(&local_80,command,separator,(string_view)ZEXT816(0));
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    retCodeOkay = local_58;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
      retCodeOkay = local_58;
    }
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_84 = 0;
  bVar3 = cmSystemTools::RunSingleCommand
                    (command,&local_80,&local_80,&local_84,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0,
                     Auto);
  if (local_84 == 0) {
    bVar4 = true;
  }
  else if (retCodeOkay == (_func_bool_int *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = (*retCodeOkay)(local_84);
  }
  if (retCodeOut != (int *)0x0) {
    iVar5 = -1;
    if (bVar4 == false) {
      iVar5 = local_84;
    }
    if (bVar3) {
      iVar5 = local_84;
    }
    *retCodeOut = iVar5;
  }
  if ((bool)(bVar3 & bVar4) == false) {
    if (comment == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x894828);
    }
    else {
      sVar6 = strlen(comment);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,comment,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": command \"",0xb);
    separator_00._M_str = " ";
    separator_00._M_len = 1;
    cmJoin(&local_50,command,separator_00,(string_view)ZEXT816(0));
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" failed (exit code ",0x14);
    iVar5 = local_84;
    p_Var2 = poVar7->_vptr_basic_ostream[-3];
    uVar1 = *(uint *)(&poVar7->field_0x18 + (long)p_Var2);
    if (local_5c == FORMAT_DECIMAL) {
      uVar10 = 2;
      uVar9 = uVar1;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"0x",2);
      p_Var2 = poVar7->_vptr_basic_ostream[-3];
      uVar10 = 8;
      uVar9 = *(uint *)(&poVar7->field_0x18 + (long)p_Var2);
    }
    *(uint *)(&poVar7->field_0x18 + (long)p_Var2) = uVar9 & 0xffffffb5 | uVar10;
    std::ostream::operator<<(poVar7,iVar5);
    *(uint *)(&poVar7->field_0x18 + (long)poVar7->_vptr_basic_ostream[-3]) = uVar1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,") with the following output:\n",0x1d)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,local_80._M_dataplus._M_p,local_80._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else if ((verbose) &&
          (lVar8 = std::__cxx11::string::find((char *)&local_80,0x697e9f,0), lVar8 == -1)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(bVar3 & bVar4);
}

Assistant:

static bool RunCommand(const char* comment,
                       std::vector<std::string> const& command, bool verbose,
                       NumberFormat exitFormat, int* retCodeOut = nullptr,
                       bool (*retCodeOkay)(int) = nullptr)
{
  if (verbose) {
    std::cout << comment << ":\n";
    std::cout << cmJoin(command, " ") << "\n";
  }
  std::string output;
  int retCode = 0;
  bool commandResult = cmSystemTools::RunSingleCommand(
    command, &output, &output, &retCode, nullptr, cmSystemTools::OUTPUT_NONE);
  bool const retCodeSuccess =
    retCode == 0 || (retCodeOkay && retCodeOkay(retCode));
  bool const success = commandResult && retCodeSuccess;
  if (retCodeOut) {
    if (commandResult || !retCodeSuccess) {
      *retCodeOut = retCode;
    } else {
      *retCodeOut = -1;
    }
  }
  if (!success) {
    std::cout << comment << ": command \"" << cmJoin(command, " ")
              << "\" failed (exit code "
              << NumberFormatter(exitFormat, retCode)
              << ") with the following output:\n"
              << output;
  } else if (verbose) {
    // always print the output of the command, unless
    // it is the dumb rc command banner
    if (output.find("Resource Compiler Version") == std::string::npos) {
      std::cout << output;
    }
  }
  return success;
}